

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-ipv6.c
# Opt level: O0

int run_test_udp_ipv6_only(void)

{
  int iVar1;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    fprintf(_stderr,"%s\n","IPv6 not supported");
    fflush(_stderr);
    eval_a._4_4_ = 7;
  }
  else {
    do_test(ipv6_recv_fail,1);
    if ((long)recv_cb_called != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-ipv6.c"
              ,0xff,"recv_cb_called","==","0",(long)recv_cb_called,"==",0);
      abort();
    }
    if ((long)send_cb_called != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-ipv6.c"
              ,0x100,"1","==","send_cb_called",1,"==",(long)send_cb_called);
      abort();
    }
    eval_a._4_4_ = 0;
  }
  return eval_a._4_4_;
}

Assistant:

TEST_IMPL(udp_ipv6_only) {
  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  do_test(ipv6_recv_fail, UV_UDP_IPV6ONLY);

  ASSERT_OK(recv_cb_called);
  ASSERT_EQ(1, send_cb_called);

  return 0;
}